

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGIPSolution.cpp
# Opt level: O0

void __thiscall
BGIPSolution::BGIPSolution
          (BGIPSolution *this,Interface_ProblemToPolicyDiscretePure *pu,size_t nrDesiredSolutions)

{
  undefined8 *puVar1;
  void *pvVar2;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  size_t in_stack_ffffffffffffff88;
  FixedCapacityPriorityQueue<boost::shared_ptr<JPPVValuePair>,_std::less<boost::shared_ptr<JPPVValuePair>_>_>
  *in_stack_ffffffffffffff90;
  BGIPSolution *this_00;
  
  *in_RDI = in_RSI;
  boost::shared_ptr<const_Interface_ProblemToPolicyDiscretePure>::shared_ptr
            ((shared_ptr<const_Interface_ProblemToPolicyDiscretePure> *)0x8cf643);
  in_RDI[3] = in_RDX;
  this_00 = (BGIPSolution *)(in_RDI + 5);
  FixedCapacityPriorityQueue<boost::shared_ptr<JPPVValuePair>,_std::less<boost::shared_ptr<JPPVValuePair>_>_>
  ::FixedCapacityPriorityQueue(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  FixedCapacityPriorityQueue<boost::shared_ptr<PartialJPDPValuePair>,_std::less<boost::shared_ptr<PartialJPDPValuePair>_>_>
  ::FixedCapacityPriorityQueue
            ((FixedCapacityPriorityQueue<boost::shared_ptr<PartialJPDPValuePair>,_std::less<boost::shared_ptr<PartialJPDPValuePair>_>_>
              *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  puVar1 = in_RDI + 0xd;
  pvVar2 = operator_new(0x20);
  std::
  priority_queue<boost::shared_ptr<JPPVValuePair>,std::vector<boost::shared_ptr<JPPVValuePair>,std::allocator<boost::shared_ptr<JPPVValuePair>>>,std::less<boost::shared_ptr<JPPVValuePair>>>
  ::
  priority_queue<std::vector<boost::shared_ptr<JPPVValuePair>,std::allocator<boost::shared_ptr<JPPVValuePair>>>,void>
            ((priority_queue<boost::shared_ptr<JPPVValuePair>,_std::vector<boost::shared_ptr<JPPVValuePair>,_std::allocator<boost::shared_ptr<JPPVValuePair>_>_>,_std::less<boost::shared_ptr<JPPVValuePair>_>_>
              *)in_stack_ffffffffffffff90);
  *puVar1 = pvVar2;
  puVar1 = in_RDI + 0xe;
  pvVar2 = operator_new(0x20);
  std::
  priority_queue<boost::shared_ptr<PartialJPDPValuePair>,std::vector<boost::shared_ptr<PartialJPDPValuePair>,std::allocator<boost::shared_ptr<PartialJPDPValuePair>>>,std::less<boost::shared_ptr<PartialJPDPValuePair>>>
  ::
  priority_queue<std::vector<boost::shared_ptr<PartialJPDPValuePair>,std::allocator<boost::shared_ptr<PartialJPDPValuePair>>>,void>
            ((priority_queue<boost::shared_ptr<PartialJPDPValuePair>,_std::vector<boost::shared_ptr<PartialJPDPValuePair>,_std::allocator<boost::shared_ptr<PartialJPDPValuePair>_>_>,_std::less<boost::shared_ptr<PartialJPDPValuePair>_>_>
              *)in_stack_ffffffffffffff90);
  *puVar1 = pvVar2;
  std::set<unsigned_long_long,_std::less<unsigned_long_long>,_std::allocator<unsigned_long_long>_>::
  set((set<unsigned_long_long,_std::less<unsigned_long_long>,_std::allocator<unsigned_long_long>_> *
      )0x8cf701);
  *(undefined1 *)(in_RDI + 0x15) = 0;
  SetNrDesiredSolutions(this_00,(size_t)in_RDI);
  return;
}

Assistant:

BGIPSolution::BGIPSolution(
        const Interface_ProblemToPolicyDiscretePure *pu,
        size_t nrDesiredSolutions
        ) :
    _m_pu(pu),
    _m_nrDesiredSolutions(nrDesiredSolutions),
    _m_qFixedK(FixedCapacityPriorityQueue<boost::shared_ptr<JPPVValuePair> >(0)),
    _m_qpFixedK(FixedCapacityPriorityQueue<boost::shared_ptr<PartialJPDPValuePair> >(0)),
    _m_qInfSize(new priority_queue<boost::shared_ptr<JPPVValuePair> >()),
    _m_qpInfSize(new priority_queue<boost::shared_ptr<PartialJPDPValuePair> >()),
    _m_issuedOverFlowWarning(false)
{
#if DBGIPSOL_LEAK
    std::cout << "Constructing BGIPSolution\n"<<std::endl;
#endif
    SetNrDesiredSolutions(_m_nrDesiredSolutions);
}